

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ini_file.cxx
# Opt level: O2

bool __thiscall xray_re::xr_ini_file::load_include(xr_ini_file *this,char *path)

{
  bool bVar1;
  xr_file_system *this_00;
  xr_reader *this_01;
  size_t sVar2;
  char *pcVar3;
  
  this_00 = xr_file_system::instance();
  this_01 = xr_file_system::r_open(this_00,path);
  if (this_01 == (xr_reader *)0x0) {
    pcVar3 = "can\'t include %s";
  }
  else {
    pcVar3 = (this_01->field_2).m_p_s8;
    sVar2 = xr_reader::size(this_01);
    bVar1 = parse(this,pcVar3,pcVar3 + sVar2,path);
    (*this_01->_vptr_xr_reader[1])(this_01);
    if (bVar1) {
      return true;
    }
    pcVar3 = "can\'t parse %s";
  }
  msg(pcVar3,path);
  return false;
}

Assistant:

bool xr_ini_file::load_include(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0) {
		msg("can't include %s", path);
		return false;
	}
	const char* p = r->pointer<const char>();
	bool status = parse(p, p + r->size(), path);
	fs.r_close(r);
	if (status)
		return true;
	msg("can't parse %s", path);
	return false;
}